

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void show_resolve_info(Curl_easy *data,Curl_dns_entry *dns)

{
  _Bool _Var1;
  dynbuf *s;
  size_t sVar2;
  char *local_d0;
  char *local_c0;
  char *local_b0;
  dynbuf *d;
  char buf [46];
  dynbuf out [2];
  Curl_addrinfo *pCStack_20;
  CURLcode result;
  Curl_addrinfo *a;
  Curl_dns_entry *dns_local;
  Curl_easy *data_local;
  
  out[1].toobig._4_4_ = CURLE_OK;
  if ((((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0) && (dns->hostname[0] != '\0')) &&
     (_Var1 = Curl_host_is_ipnum(dns->hostname), !_Var1)) {
    pCStack_20 = dns->addr;
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      if (dns->hostname[0] == '\0') {
        local_b0 = "(none)";
      }
      else {
        local_b0 = dns->hostname;
      }
      Curl_infof(data,"Host %s:%d was resolved.",local_b0,(ulong)(uint)dns->hostport);
    }
    Curl_dyn_init((dynbuf *)(buf + 0x28),0x400);
    Curl_dyn_init((dynbuf *)&out[0].toobig,0x400);
    for (; pCStack_20 != (Curl_addrinfo *)0x0; pCStack_20 = pCStack_20->ai_next) {
      if ((pCStack_20->ai_family == 10) || (pCStack_20->ai_family == 2)) {
        s = (dynbuf *)(buf + (long)(int)(uint)(pCStack_20->ai_family != 2) * 0x20 + 0x28);
        Curl_printable_address(pCStack_20,(char *)&d,0x2e);
        sVar2 = Curl_dyn_len(s);
        if (sVar2 != 0) {
          out[1].toobig._4_4_ = Curl_dyn_addn(s,", ",2);
        }
        if (out[1].toobig._4_4_ == CURLE_OK) {
          out[1].toobig._4_4_ = Curl_dyn_add(s,(char *)&d);
        }
        if (out[1].toobig._4_4_ != CURLE_OK) {
          if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          {
            Curl_infof(data,"too many IP, can\'t show");
          }
          goto LAB_00d0229b;
        }
      }
    }
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      sVar2 = Curl_dyn_len((dynbuf *)&out[0].toobig);
      if (sVar2 == 0) {
        local_c0 = "(none)";
      }
      else {
        local_c0 = Curl_dyn_ptr((dynbuf *)&out[0].toobig);
      }
      Curl_infof(data,"IPv6: %s",local_c0);
    }
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      sVar2 = Curl_dyn_len((dynbuf *)(buf + 0x28));
      if (sVar2 == 0) {
        local_d0 = "(none)";
      }
      else {
        local_d0 = Curl_dyn_ptr((dynbuf *)(buf + 0x28));
      }
      Curl_infof(data,"IPv4: %s",local_d0);
    }
LAB_00d0229b:
    Curl_dyn_free((dynbuf *)(buf + 0x28));
    Curl_dyn_free((dynbuf *)&out[0].toobig);
  }
  return;
}

Assistant:

static void show_resolve_info(struct Curl_easy *data,
                              struct Curl_dns_entry *dns)
{
  struct Curl_addrinfo *a;
  CURLcode result = CURLE_OK;
#ifdef CURLRES_IPV6
  struct dynbuf out[2];
#else
  struct dynbuf out[1];
#endif
  DEBUGASSERT(data);
  DEBUGASSERT(dns);

  if(!data->set.verbose ||
     /* ignore no name or numerical IP addresses */
     !dns->hostname[0] || Curl_host_is_ipnum(dns->hostname))
    return;

  a = dns->addr;

  infof(data, "Host %s:%d was resolved.",
        (dns->hostname[0] ? dns->hostname : "(none)"), dns->hostport);

  Curl_dyn_init(&out[0], 1024);
#ifdef CURLRES_IPV6
  Curl_dyn_init(&out[1], 1024);
#endif

  while(a) {
    if(
#ifdef CURLRES_IPV6
       a->ai_family == PF_INET6 ||
#endif
       a->ai_family == PF_INET) {
      char buf[MAX_IPADR_LEN];
      struct dynbuf *d = &out[(a->ai_family != PF_INET)];
      Curl_printable_address(a, buf, sizeof(buf));
      if(Curl_dyn_len(d))
        result = Curl_dyn_addn(d, ", ", 2);
      if(!result)
        result = Curl_dyn_add(d, buf);
      if(result) {
        infof(data, "too many IP, can't show");
        goto fail;
      }
    }
    a = a->ai_next;
  }

#ifdef CURLRES_IPV6
  infof(data, "IPv6: %s",
        (Curl_dyn_len(&out[1]) ? Curl_dyn_ptr(&out[1]) : "(none)"));
#endif
  infof(data, "IPv4: %s",
        (Curl_dyn_len(&out[0]) ? Curl_dyn_ptr(&out[0]) : "(none)"));

fail:
  Curl_dyn_free(&out[0]);
#ifdef CURLRES_IPV6
  Curl_dyn_free(&out[1]);
#endif
}